

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O3

SignParameter * __thiscall
cfd::SignParameter::operator=(SignParameter *this,SignParameter *sign_parameter)

{
  pointer puVar1;
  undefined1 local_48 [8];
  pointer puStack_40;
  _Alloc_hider local_38;
  uchar local_28 [16];
  
  if (this != sign_parameter) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)sign_parameter);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_38._M_p;
    local_48 = (undefined1  [8])0x0;
    puStack_40 = (pointer)0x0;
    local_38._M_p = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48);
      }
    }
    this->data_type_ = sign_parameter->data_type_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &sign_parameter->related_pubkey_);
    puVar1 = (this->related_pubkey_).data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->related_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48;
    (this->related_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    (this->related_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_38._M_p;
    local_48 = (undefined1  [8])0x0;
    puStack_40 = (pointer)0x0;
    local_38._M_p = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48);
      }
    }
    this->der_encode_ = sign_parameter->der_encode_;
    cfd::core::SigHashType::SigHashType((SigHashType *)local_48,&sign_parameter->sighash_type_);
    cfd::core::SigHashType::operator=(&this->sighash_type_,(SigHashType *)local_48);
    cfd::core::ScriptOperator::ScriptOperator((ScriptOperator *)local_48,&sign_parameter->op_code_);
    cfd::core::ScriptOperator::operator=(&this->op_code_,(ScriptOperator *)local_48);
    local_48 = (undefined1  [8])&PTR__ScriptOperator_002b0f30;
    if ((uchar *)local_38._M_p != local_28) {
      operator_delete(local_38._M_p);
    }
  }
  return this;
}

Assistant:

SignParameter& SignParameter::operator=(const SignParameter& sign_parameter) {
  if (this != &sign_parameter) {
    data_ = sign_parameter.GetData();
    data_type_ = sign_parameter.GetDataType();
    related_pubkey_ = sign_parameter.GetRelatedPubkey();
    der_encode_ = sign_parameter.IsDerEncode();
    sighash_type_ = sign_parameter.GetSigHashType();
    op_code_ = sign_parameter.GetOpCode();
  }
  return *this;
}